

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O0

void sys_audiodevnumbertoname(int output,int devno,char *name,int namesize)

{
  int local_8038;
  int local_8034;
  int cancallback;
  int canmulti;
  int noutdevs;
  int nindevs;
  char outdevlist [16384];
  char indevlist [16384];
  int namesize_local;
  char *name_local;
  int devno_local;
  int output_local;
  
  canmulti = 0;
  cancallback = 0;
  if (devno < 0) {
    *name = '\0';
  }
  else {
    sys_get_audio_devs(outdevlist + 0x3ff8,&canmulti,(char *)&noutdevs,&cancallback,&local_8034,
                       &local_8038,0x80,0x80,audio_nextsettings.a_api);
    if ((output == 0) || (cancallback <= devno)) {
      if ((output == 0) && (devno < canmulti)) {
        strncpy(name,outdevlist + (long)(devno << 7) + 0x3ff8,(long)namesize);
      }
      else {
        *name = '\0';
      }
    }
    else {
      strncpy(name,(char *)((long)&noutdevs + (long)(devno << 7)),(long)namesize);
    }
    name[namesize + -1] = '\0';
  }
  return;
}

Assistant:

void sys_audiodevnumbertoname(int output, int devno, char *name, int namesize)
{
    char indevlist[MAXNDEV*DEVDESCSIZE], outdevlist[MAXNDEV*DEVDESCSIZE];
    int nindevs = 0, noutdevs = 0, canmulti, cancallback;
    if (devno < 0)
    {
        *name = 0;
        return;
    }
    sys_get_audio_devs(indevlist, &nindevs, outdevlist, &noutdevs,
        &canmulti, &cancallback, MAXNDEV, DEVDESCSIZE,
            audio_nextsettings.a_api);
    if (output && (devno < noutdevs))
        strncpy(name, outdevlist + devno * DEVDESCSIZE, namesize);
    else if (!output && (devno < nindevs))
        strncpy(name, indevlist + devno * DEVDESCSIZE, namesize);
    else *name = 0;
    name[namesize-1] = 0;
}